

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O3

QTableWidgetItem * __thiscall QTableWidget::horizontalHeaderItem(QTableWidget *this,int column)

{
  long lVar1;
  QTableWidgetItem *pQVar2;
  
  lVar1 = QMetaObject::cast((QObject *)&QTableModel::staticMetaObject);
  if ((ulong)(long)column < *(ulong *)(lVar1 + 0x58)) {
    pQVar2 = *(QTableWidgetItem **)(*(long *)(lVar1 + 0x50) + (long)column * 8);
  }
  else {
    pQVar2 = (QTableWidgetItem *)0x0;
  }
  return pQVar2;
}

Assistant:

QTableWidgetItem *QTableWidget::horizontalHeaderItem(int column) const
{
    Q_D(const QTableWidget);
    return d->tableModel()->horizontalHeaderItem(column);
}